

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O0

UnionOp * __thiscall xercesc_4_0::OpFactory::createUnionOp(OpFactory *this,XMLSize_t size)

{
  UnionOp *this_00;
  UnionOp *tmpOp;
  XMLSize_t size_local;
  OpFactory *this_local;
  
  this_00 = (UnionOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  UnionOp::UnionOp(this_00,O_UNION,size,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::Op>::addElement
            (&this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>,(Op *)this_00);
  return this_00;
}

Assistant:

UnionOp* OpFactory::createUnionOp(XMLSize_t size) {

    UnionOp* tmpOp = new (fMemoryManager) UnionOp(Op::O_UNION, size, fMemoryManager);

    fOpVector->addElement(tmpOp);
    return tmpOp;
}